

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O1

uint32_t msr_get_supported_cpu_model(void)

{
  int iVar1;
  undefined8 in_RAX;
  uint32_t cpu_model;
  uint32_t cpu_family;
  undefined8 local_8;
  
  local_8 = in_RAX;
  cpuid_get_family_model((uint32_t *)((long)&local_8 + 4),(uint32_t *)&local_8);
  iVar1 = cpuid_is_vendor_intel();
  if (iVar1 != 0) {
    iVar1 = cpuid_is_cpu_supported(local_8._4_4_,(uint32_t)local_8);
    if (iVar1 != 0) {
      return (uint32_t)local_8;
    }
  }
  msr_get_supported_cpu_model_cold_1();
  return 0;
}

Assistant:

uint32_t msr_get_supported_cpu_model(void) {
  uint32_t cpu_family;
  uint32_t cpu_model;
  cpuid_get_family_model(&cpu_family, &cpu_model);
  if (!cpuid_is_vendor_intel() || !cpuid_is_cpu_supported(cpu_family, cpu_model)) {
    raplcap_log(ERROR, "CPU not supported: Family=%"PRIu32", Model=%02X\n", cpu_family, cpu_model);
    return 0;
  }
  return cpu_model;
}